

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O2

Result __thiscall spectest::JSONParser::ParseType(JSONParser *this,Type *out_type)

{
  bool bVar1;
  Result RVar2;
  Type TVar3;
  Enum EVar4;
  string type_str;
  
  type_str._M_dataplus._M_p = (pointer)&type_str.field_2;
  type_str._M_string_length = 0;
  type_str.field_2._M_local_buf[0] = '\0';
  RVar2 = ParseString(this,&type_str);
  EVar4 = Error;
  if (RVar2.enum_ != Error) {
    bVar1 = std::operator==(&type_str,"i32");
    if (bVar1) {
      TVar3.enum_ = I32;
      TVar3.type_index_ = 0;
    }
    else {
      bVar1 = std::operator==(&type_str,"f32");
      if (bVar1) {
        TVar3.enum_ = F32;
        TVar3.type_index_ = 0;
      }
      else {
        bVar1 = std::operator==(&type_str,"i64");
        if (bVar1) {
          TVar3.enum_ = I64;
          TVar3.type_index_ = 0;
        }
        else {
          bVar1 = std::operator==(&type_str,"f64");
          if (bVar1) {
            TVar3.enum_ = F64;
            TVar3.type_index_ = 0;
          }
          else {
            bVar1 = std::operator==(&type_str,"v128");
            if (bVar1) {
              TVar3.enum_ = V128;
              TVar3.type_index_ = 0;
            }
            else {
              bVar1 = std::operator==(&type_str,"i8");
              if (bVar1) {
                TVar3.enum_ = I8;
                TVar3.type_index_ = 0;
              }
              else {
                bVar1 = std::operator==(&type_str,"i16");
                if (bVar1) {
                  TVar3.enum_ = I16;
                  TVar3.type_index_ = 0;
                }
                else {
                  bVar1 = std::operator==(&type_str,"funcref");
                  if (bVar1) {
                    TVar3.enum_ = FuncRef;
                    TVar3.type_index_ = 0;
                  }
                  else {
                    bVar1 = std::operator==(&type_str,"externref");
                    if (bVar1) {
                      TVar3.enum_ = ExternRef;
                      TVar3.type_index_ = 0;
                    }
                    else {
                      bVar1 = std::operator==(&type_str,"exnref");
                      if (!bVar1) {
                        PrintError(this,"unknown type: \"%s\"",type_str._M_dataplus._M_p);
                        goto LAB_0011b137;
                      }
                      TVar3.enum_ = ExnRef;
                      TVar3.type_index_ = 0;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    *out_type = TVar3;
    EVar4 = Ok;
  }
LAB_0011b137:
  std::__cxx11::string::_M_dispose();
  return (Result)EVar4;
}

Assistant:

wabt::Result JSONParser::ParseType(Type* out_type) {
  std::string type_str;
  CHECK_RESULT(ParseString(&type_str));

  if (type_str == "i32") {
    *out_type = Type::I32;
  } else if (type_str == "f32") {
    *out_type = Type::F32;
  } else if (type_str == "i64") {
    *out_type = Type::I64;
  } else if (type_str == "f64") {
    *out_type = Type::F64;
  } else if (type_str == "v128") {
    *out_type = Type::V128;
  } else if (type_str == "i8") {
    *out_type = Type::I8;
  } else if (type_str == "i16") {
    *out_type = Type::I16;
  } else if (type_str == "funcref") {
    *out_type = Type::FuncRef;
  } else if (type_str == "externref") {
    *out_type = Type::ExternRef;
  } else if (type_str == "exnref") {
    *out_type = Type::ExnRef;
  } else {
    PrintError("unknown type: \"%s\"", type_str.c_str());
    return wabt::Result::Error;
  }
  return wabt::Result::Ok;
}